

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O2

double __thiscall icu_63::double_conversion::Double::NextDouble(Double *this)

{
  ulong uVar1;
  double dVar2;
  
  uVar1 = this->d64_;
  if (uVar1 == 0x7ff0000000000000) {
    return INFINITY;
  }
  if ((long)uVar1 < 0) {
    if ((uVar1 & 0x7fffffffffffffff) == 0) {
      return 0.0;
    }
    dVar2 = (double)(uVar1 - 1);
  }
  else {
    dVar2 = (double)(uVar1 + 1);
  }
  return dVar2;
}

Assistant:

double NextDouble() const {
    if (d64_ == kInfinity) return Double(kInfinity).value();
    if (Sign() < 0 && Significand() == 0) {
      // -0.0
      return 0.0;
    }
    if (Sign() < 0) {
      return Double(d64_ - 1).value();
    } else {
      return Double(d64_ + 1).value();
    }
  }